

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineOutputFile::copyPixels(DeepScanLineOutputFile *this,DeepScanLineInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  pthread_mutex_t *__mutex;
  uint64_t sampleCountTableSize;
  uint64_t packedDataSize;
  uint64_t unpackedDataSize;
  OutputStreamMutex *filedata;
  int iVar3;
  DeepScanLineOutputFile *pDVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  Header *this_00;
  string *__lhs;
  Box2i *pBVar8;
  Box2i *src;
  LineOrder *pLVar9;
  Compression *pCVar10;
  ChannelList *this_01;
  ChannelList *other;
  Data *pDVar11;
  ArgExc *pAVar12;
  ostream *poVar13;
  char *pcVar14;
  LogicExc *this_02;
  uint64_t dataSize;
  DeepScanLineOutputFile *local_1c0;
  vector<char,_std::allocator<char>_> data;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar11 = this->_data;
  this_00 = DeepScanLineInputFile::header(in);
  bVar6 = Header::hasType(this_00);
  if (bVar6) {
    __lhs = Header::type_abi_cxx11_(this_00);
    bVar6 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)DEEPSCANLINE_abi_cxx11_);
    if (!bVar6) {
      pBVar8 = Header::dataWindow(&pDVar11->header);
      src = Header::dataWindow(this_00);
      bVar6 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar8,src);
      if (!bVar6) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar13 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Cannot copy pixels from image file \"");
        pcVar14 = DeepScanLineInputFile::fileName(in);
        poVar13 = std::operator<<(poVar13,pcVar14);
        poVar13 = std::operator<<(poVar13,"\" to image file \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        std::operator<<(poVar13,"\". The files have different data windows.");
        pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
        __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pLVar9 = Header::lineOrder(&pDVar11->header);
      LVar1 = *pLVar9;
      pLVar9 = Header::lineOrder(this_00);
      if (LVar1 != *pLVar9) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar13 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar14 = DeepScanLineInputFile::fileName(in);
        poVar13 = std::operator<<(poVar13,pcVar14);
        poVar13 = std::operator<<(poVar13,"\" to image file \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        std::operator<<(poVar13,"\" failed. The files have different line orders.");
        pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
        __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pCVar10 = Header::compression(&pDVar11->header);
      CVar2 = *pCVar10;
      pCVar10 = Header::compression(this_00);
      if (CVar2 != *pCVar10) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar13 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar14 = DeepScanLineInputFile::fileName(in);
        poVar13 = std::operator<<(poVar13,pcVar14);
        poVar13 = std::operator<<(poVar13,"\" to image file \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        std::operator<<(poVar13,"\" failed. The files use different compression methods.");
        pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
        __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      this_01 = Header::channels(&pDVar11->header);
      other = Header::channels(this_00);
      bVar6 = ChannelList::operator==(this_01,other);
      if (bVar6) {
        pBVar8 = Header::dataWindow(&pDVar11->header);
        if (this->_data->missingScanLines == ((pBVar8->max).y - (pBVar8->min).y) + 1) {
          std::vector<char,_std::allocator<char>_>::vector(&data,0x1000,(allocator_type *)&dataSize)
          ;
          pDVar11 = this->_data;
          iVar7 = pDVar11->missingScanLines;
          local_1c0 = this;
          while (pDVar4 = local_1c0, 0 < iVar7) {
            dataSize = (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
            DeepScanLineInputFile::rawPixelData
                      (in,pDVar11->currentScanLine,
                       data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,&dataSize);
            if ((ulong)((long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) < dataSize) {
              std::vector<char,_std::allocator<char>_>::resize(&data,dataSize);
              DeepScanLineInputFile::rawPixelData
                        (in,pDVar4->_data->currentScanLine,
                         data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,&dataSize);
            }
            pcVar5 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sampleCountTableSize =
                 *(uint64_t *)
                  (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 4);
            packedDataSize =
                 *(uint64_t *)
                  (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc);
            unpackedDataSize =
                 *(uint64_t *)
                  (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x14);
            pDVar11 = pDVar4->_data;
            filedata = pDVar11->_streamData;
            iVar7 = lineBufferMinY(pDVar11->currentScanLine,pDVar11->minY,pDVar11->linesInBuffer);
            anon_unknown_7::writePixelData
                      (filedata,pDVar11,iVar7,pcVar5 + sampleCountTableSize + 0x1c,packedDataSize,
                       unpackedDataSize,pcVar5 + 0x1c,sampleCountTableSize);
            pDVar11 = local_1c0->_data;
            iVar7 = pDVar11->linesInBuffer;
            iVar3 = -iVar7;
            if (pDVar11->lineOrder == INCREASING_Y) {
              iVar3 = iVar7;
            }
            pDVar11->currentScanLine = pDVar11->currentScanLine + iVar3;
            iVar7 = pDVar11->missingScanLines - iVar7;
            pDVar11->missingScanLines = iVar7;
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&data.super__Vector_base<char,_std::allocator<char>_>);
          pthread_mutex_unlock(__mutex);
          return;
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar13 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar14 = DeepScanLineInputFile::fileName(in);
        poVar13 = std::operator<<(poVar13,pcVar14);
        poVar13 = std::operator<<(poVar13,"\" to image file \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        poVar13 = std::operator<<(poVar13,"\" failed. \"");
        pcVar14 = fileName(this);
        poVar13 = std::operator<<(poVar13,pcVar14);
        std::operator<<(poVar13,"\" already contains pixel data.");
        this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::LogicExc::LogicExc(this_02,(stringstream *)&data);
        __cxa_throw(this_02,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&data);
      poVar13 = std::operator<<((ostream *)
                                &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                                "Quick pixel copy from image file \"");
      pcVar14 = DeepScanLineInputFile::fileName(in);
      poVar13 = std::operator<<(poVar13,pcVar14);
      poVar13 = std::operator<<(poVar13,"\" to image file \"");
      pcVar14 = fileName(this);
      poVar13 = std::operator<<(poVar13,pcVar14);
      std::operator<<(poVar13,"\" failed.  The files have different channel lists.");
      pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
      __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  poVar13 = std::operator<<((ostream *)
                            &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                            "Cannot copy pixels from image file \"");
  pcVar14 = DeepScanLineInputFile::fileName(in);
  poVar13 = std::operator<<(poVar13,pcVar14);
  poVar13 = std::operator<<(poVar13,"\" to image file \"");
  pcVar14 = fileName(this);
  poVar13 = std::operator<<(poVar13,pcVar14);
  std::operator<<(poVar13,"\": the input needs to be a deep scanline image");
  pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
  __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineOutputFile::copyPixels (DeepScanLineInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!inHdr.hasType () || inHdr.type () != DEEPSCANLINE)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\": the input needs to be a deep scanline image");
    }
    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed.  "
                   "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i& dataWindow = hdr.dataWindow ();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "\""
                << fileName ()
                << "\" already contains "
                   "pixel data.");

    //
    // Copy the pixel data.
    //

    vector<char> data (4096);

    while (_data->missingScanLines > 0)
    {
        uint64_t dataSize = (uint64_t) data.size ();
        in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            // block wasn't big enough - go again with enough memory this time
            data.resize (dataSize);
            in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        }

        // extract header from block to pass to writePixelData

        bytesOruint64_t tmp;
        memcpy (&tmp.b, &data[4], 8);
        uint64_t packedSampleCountSize = tmp.i;

        memcpy (&tmp.b, &data[12], 8);
        uint64_t packedDataSize = tmp.i;

        memcpy (&tmp.b, &data[20], 8);
        uint64_t unpackedDataSize = tmp.i;

        const char* sampleCountTable = &data[0] + 28;
        const char* pixelData        = sampleCountTable + packedSampleCountSize;

        writePixelData (
            _data->_streamData,
            _data,
            lineBufferMinY (
                _data->currentScanLine, _data->minY, _data->linesInBuffer),
            pixelData,
            packedDataSize,
            unpackedDataSize,
            sampleCountTable,
            packedSampleCountSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)
                                      ? _data->linesInBuffer
                                      : -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}